

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.hpp
# Opt level: O2

endpoint * __thiscall
asio::detail::deref_connect_result<asio::ip::tcp,asio::ip::basic_resolver_iterator<asio::ip::tcp>>
          (endpoint *__return_storage_ptr__,detail *this,
          basic_resolver_iterator<asio::ip::tcp> *iter,error_code *ec)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  if (*(int *)&(iter->values_).
               super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr != 0) {
    (__return_storage_ptr__->impl_).data_.v6.sin6_scope_id = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 2;
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)(**(long **)this + *(long *)(this + 0x10) * 0x60);
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  puVar1 = (undefined8 *)(**(long **)this + 0xc + *(long *)(this + 0x10) * 0x60);
  uVar4 = puVar1[1];
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) = *puVar1;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) = uVar4;
  *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = uVar2;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = uVar3;
  return __return_storage_ptr__;
}

Assistant:

inline typename Protocol::endpoint deref_connect_result(
      Iterator iter, asio::error_code& ec)
  {
    return ec ? typename Protocol::endpoint() : *iter;
  }